

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O3

int arkStep_NlsResidual_MassIdent(N_Vector zcor,N_Vector r,void *arkode_mem)

{
  int iVar1;
  int iVar2;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  N_Vector X [3];
  ARKodeARKStepMem local_58;
  ARKodeMem local_50;
  N_Vector local_48;
  N_Vector local_40;
  N_Vector local_38;
  realtype local_28 [3];
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"arkStep_NlsResidual_MassIdent",&local_50,&local_58);
  if (iVar1 == 0) {
    N_VLinearSum(1.0,local_58->zpred,1.0,zcor,local_50->ycur);
    iVar2 = (*local_58->nls_fi)(local_50->tcur,local_50->ycur,local_58->Fi[local_58->istage],
                                local_50->user_data);
    local_58->nfi = local_58->nfi + 1;
    if (iVar2 < 0) {
      iVar1 = -8;
    }
    else {
      iVar1 = 9;
      if (iVar2 == 0) {
        local_28[0] = 1.0;
        local_28[1] = -1.0;
        local_40 = local_58->sdata;
        local_28[2] = -local_58->gamma;
        local_38 = local_58->Fi[local_58->istage];
        local_48 = zcor;
        iVar2 = N_VLinearCombination(3,local_28,&local_48,r);
        iVar1 = -0x1c;
        if (iVar2 == 0) {
          iVar1 = 0;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int arkStep_NlsResidual_MassIdent(N_Vector zcor, N_Vector r, void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;
  realtype c[3];
  N_Vector X[3];

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_NlsResidual_MassIdent",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute implicit RHS */
  retval = step_mem->nls_fi(ark_mem->tcur, ark_mem->ycur,
                            step_mem->Fi[step_mem->istage],
                            ark_mem->user_data);
  step_mem->nfi++;
  if (retval < 0) return(ARK_RHSFUNC_FAIL);
  if (retval > 0) return(RHSFUNC_RECVR);

  /* compute residual via linear combination */
  c[0] = ONE;
  X[0] = zcor;
  c[1] = -ONE;
  X[1] = step_mem->sdata;
  c[2] = -step_mem->gamma;
  X[2] = step_mem->Fi[step_mem->istage];
  retval = N_VLinearCombination(3, c, X, r);
  if (retval != 0)  return(ARK_VECTOROP_ERR);
  return(ARK_SUCCESS);
}